

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::
TestFactoryImpl<base_iterator_matrix_sparse_element_test_default_constructor_Test>::CreateTest
          (TestFactoryImpl<base_iterator_matrix_sparse_element_test_default_constructor_Test> *this)

{
  Test *this_00;
  TestFactoryImpl<base_iterator_matrix_sparse_element_test_default_constructor_Test> *this_local;
  
  this_00 = (Test *)operator_new(0x40);
  base_iterator_matrix_sparse_element_test_default_constructor_Test::
  base_iterator_matrix_sparse_element_test_default_constructor_Test
            ((base_iterator_matrix_sparse_element_test_default_constructor_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }